

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

reference __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
::iterator::operator*(iterator *this)

{
  code *pcVar1;
  iterator *piVar2;
  iterator *piVar3;
  iterator *piVar4;
  iterator *piVar5;
  iterator *piVar6;
  reference extraout_RAX;
  bool bVar7;
  iterator *piVar8;
  undefined8 *in_RSI;
  
  pcVar1 = (code *)this->ctrl_;
  if (pcVar1 == (code *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,std::allocator<google::protobuf::FileDescriptor_const*>>
    ::iterator::operator*((iterator *)this);
LAB_001fa995:
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,std::allocator<google::protobuf::FileDescriptor_const*>>
    ::iterator::operator*((iterator *)this);
  }
  else {
    if (pcVar1 == absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>)
    goto LAB_001fa995;
    if (-1 < (char)*pcVar1) {
      return (this->field_1).slot_;
    }
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,std::allocator<google::protobuf::FileDescriptor_const*>>
  ::iterator::operator*((iterator *)this);
  piVar2 = (iterator *)this->ctrl_;
  if ((piVar2 == (iterator *)
                 absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> ||
       piVar2 == (iterator *)0x0) || (-1 < (char)*(code *)&piVar2->ctrl_)) {
    piVar3 = (iterator *)*in_RSI;
    if ((piVar3 != (iterator *)
                   absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
         piVar3 != (iterator *)0x0) && ((char)*(code *)&piVar3->ctrl_ < '\0')) goto LAB_001faa8e;
    if (piVar2 == (iterator *)
                  absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
        piVar3 == (iterator *)
                  absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) {
LAB_001faa81:
      return (reference)CONCAT71((int7)((ulong)piVar2 >> 8),piVar2 == piVar3);
    }
    if ((piVar2 ==
        (iterator *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) ==
        (piVar3 ==
        (iterator *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>)) {
      if (piVar2 == (iterator *)0x0 || piVar3 == (iterator *)0x0) goto LAB_001faa81;
      if ((piVar3 == (iterator *)&kSooControl) == (piVar2 == (iterator *)&kSooControl)) {
        this = (iterator *)(this->field_1).slot_;
        piVar4 = (iterator *)in_RSI[1];
        if (piVar2 == (iterator *)&kSooControl) {
          bVar7 = this == piVar4;
        }
        else {
          piVar8 = piVar4;
          piVar5 = piVar3;
          piVar6 = this;
          if (piVar3 < piVar2) {
            piVar8 = this;
            piVar5 = piVar2;
            piVar6 = piVar4;
          }
          bVar7 = piVar6 <= piVar8 && piVar5 < piVar6;
        }
        if (bVar7) goto LAB_001faa81;
      }
      goto LAB_001faa98;
    }
  }
  else {
    container_internal::operator==();
LAB_001faa8e:
    container_internal::operator==();
  }
  container_internal::operator==();
LAB_001faa98:
  container_internal::operator==();
  if (this->ctrl_ == (ctrl_t *)0x1) {
    __assert_fail("!is_soo()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xf6a,
                  "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::prefetch_heap_block() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>]"
                 );
  }
  if (this->ctrl_ == (ctrl_t *)0x0) {
    __assert_fail("!kEnabled || cap >= kCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb37,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>]"
                 );
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::control((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)this);
  return extraout_RAX;
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }